

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,decimal_fp<double> *fp,
          basic_format_specs<char16_t> *specs,float_specs fspecs,locale_ref loc)

{
  char16_t *pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  size_t sVar16;
  char16_t decimal_point;
  bool pointy;
  char16_t zero;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  digit_grouping<char16_t> grouping;
  anon_class_40_8_70a3e612 write;
  undefined1 local_e2 [2];
  bool local_e0 [6];
  bool local_da [2];
  bool local_d8 [4];
  sign_t local_d4;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  short local_98;
  basic_format_specs<char16_t> *local_90;
  void *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  bool *local_48;
  bool *local_40;
  bool *local_38;
  
  pcVar1 = (char16_t *)fp->significand;
  lVar4 = 0x3f;
  if (((ulong)pcVar1 | 1) != 0) {
    for (; ((ulong)pcVar1 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  iVar10 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] -
           (uint)(pcVar1 < *(char16_t **)
                            (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                            (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] * 8));
  local_da[0] = true;
  local_da[1] = false;
  uVar13 = fspecs._4_4_;
  local_d4 = uVar13 >> 8 & 0xff;
  local_d8 = (bool  [4])iVar10;
  local_c8._0_8_ = pcVar1;
  local_80 = (undefined1  [8])fspecs;
  if (iVar10 < 0) {
LAB_00162b90:
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  uVar15 = (iVar10 + 1) - (uint)(local_d4 == none);
  uVar6 = (ulong)uVar15;
  local_e2 = (undefined1  [2])0x2e;
  local_78._0_4_ = local_d4;
  if ((uVar13 >> 0x11 & 1) != 0) {
    local_d0.container = (buffer<char16_t> *)fp;
    local_c8._8_4_ = local_d4;
    local_90 = specs;
    local_88 = loc.locale_;
    cVar2 = fmt::v8::detail::decimal_point_impl<char>(loc);
    local_e2 = (undefined1  [2])(short)cVar2;
    specs = local_90;
    fp = (decimal_fp<double> *)local_d0;
    loc.locale_ = local_88;
    local_78._0_4_ = local_c8._8_4_;
  }
  iVar3 = *(int *)&((buffer<char16_t> *)fp)->ptr_;
  local_c8._12_4_ = iVar10 + iVar3;
  iVar11 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_001628bf:
    iVar3 = iVar10 + iVar3 + -1;
    if ((uVar13 >> 0x14 & 1) == 0) {
      iVar7 = 0;
      if (iVar10 == 1) {
        local_e2 = (undefined1  [2])0x0;
        iVar7 = 0;
      }
    }
    else {
      iVar7 = 0;
      if (0 < iVar11 - iVar10) {
        iVar7 = iVar11 - iVar10;
      }
      uVar6 = (ulong)(uVar15 + iVar7);
    }
    local_78._20_2_ = local_e2;
    local_78._16_4_ = iVar10;
    local_60._0_6_ = CONCAT24(L'0',iVar7);
    local_60 = (buffer<char16_t> *)
               (CONCAT17(local_60._7_1_,
                         CONCAT16(((uVar13 >> 0x10 & 1) == 0) << 5,(undefined6)local_60)) |
               0x45000000000000);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_58._4_4_,iVar3);
    local_78._8_8_ = pcVar1;
    if (0 < specs->width) {
      if ((int)local_c8._12_4_ < 1) {
        iVar3 = 1 - local_c8._12_4_;
      }
      lVar4 = 2;
      if (99 < iVar3) {
        lVar4 = (ulong)(999 < iVar3) + 3;
      }
      sVar16 = uVar6 + (3 - (ulong)(local_e2 == (undefined1  [2])0x0)) + lVar4;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (out,specs,sVar16,sVar16,(anon_class_40_8_70a3e612 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
    }
    bVar5 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char16_t,_fmt::v8::detail::digit_grouping<char16_t>_>
            ::anon_class_40_8_70a3e612::operator()
                      ((anon_class_40_8_70a3e612 *)local_78,out.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar7 = 0x10;
    if (0 < iVar11) {
      iVar7 = iVar11;
    }
    if (((int)local_c8._12_4_ < -3) || (iVar7 < (int)local_c8._12_4_)) goto LAB_001628bf;
  }
  if (iVar3 < 0) {
    if ((int)local_c8._12_4_ < 1) {
      iVar3 = -local_c8._12_4_;
      local_b8._M_allocated_capacity._0_4_ = iVar3;
      if (SBORROW4(iVar11,iVar3) != iVar11 + local_c8._12_4_ < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar11;
      }
      if (iVar11 < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar3;
      }
      if (iVar10 != 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar3;
      }
      if (iVar10 == 0 && local_b8._M_allocated_capacity._0_4_ == 0) {
        local_e0[0] = (bool)(char)((uVar13 & 0x100000) >> 0x14);
        iVar10 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_e0[0] = true;
        iVar10 = 2;
        if ((int)local_b8._M_allocated_capacity._0_4_ < 0) goto LAB_00162b90;
      }
      sVar16 = (uint)(iVar10 + local_b8._M_allocated_capacity._0_4_) + uVar6;
      local_78._0_8_ = &local_d4;
      local_78._8_8_ = local_da;
      local_78._16_8_ = local_e0;
      local_60 = (buffer<char16_t> *)local_e2;
      local_58 = &local_b8;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c8;
      local_48 = local_d8;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_&>
                        (out,specs,sVar16,sVar16,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
    }
    uVar14 = 0;
    local_e0._0_4_ = iVar11 - iVar10 & (int)(uVar13 << 0xb) >> 0x1f;
    uVar12 = (ulong)(uint)local_e0._0_4_;
    if ((int)local_e0._0_4_ < 1) {
      uVar12 = uVar14;
    }
    local_d0.container = out.container;
    digit_grouping<char16_t>::digit_grouping
              ((digit_grouping<char16_t> *)&local_b8,loc,(bool)((byte)(uVar13 >> 0x11) & 1));
    if (local_98 != 0) {
      pcVar8 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_);
      pcVar9 = pcVar8 + local_b8._8_8_;
      lVar4 = 0;
      do {
        if (pcVar8 == pcVar9) {
          cVar2 = pcVar9[-1];
          pcVar8 = pcVar9;
        }
        else {
          cVar2 = *pcVar8;
          if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_00162bb2;
          pcVar8 = pcVar8 + 1;
        }
        uVar13 = (int)uVar14 + (int)cVar2;
        uVar14 = (ulong)uVar13;
        if ((int)local_d8 <= (int)uVar13) goto LAB_00162bb2;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_00162bb2:
    sVar16 = uVar6 + uVar12 + 1 + lVar4;
    local_78._0_8_ = &local_d4;
    local_78._8_8_ = local_c8;
    local_78._16_8_ = local_d8;
    local_60 = (buffer<char16_t> *)(local_c8 + 0xc);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e2;
    local_48 = local_e0;
    local_40 = local_da;
    local_50 = &local_b8;
    bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_&>
                      (local_d0,specs,sVar16,sVar16,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_00162c07;
  }
  uVar6 = (ulong)(iVar3 + uVar15);
  local_e0._0_4_ = iVar11 - local_c8._12_4_;
  if ((uVar13 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e0._0_4_) {
      if ((int)local_e0._0_4_ < 1) goto LAB_00162a8b;
    }
    else {
      local_e0[0] = true;
      local_e0[1] = false;
      local_e0[2] = false;
      local_e0[3] = false;
    }
    uVar6 = uVar6 + (uint)local_e0._0_4_ + 1;
  }
LAB_00162a8b:
  digit_grouping<char16_t>::digit_grouping
            ((digit_grouping<char16_t> *)&local_b8,loc,(bool)((byte)(uVar13 >> 0x11) & 1));
  iVar10 = 0;
  if (local_98 != 0) {
    pcVar8 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                              local_b8._M_allocated_capacity._0_4_);
    pcVar9 = pcVar8 + local_b8._8_8_;
    lVar4 = 0;
    do {
      if (pcVar8 == pcVar9) {
        cVar2 = pcVar9[-1];
        pcVar8 = pcVar9;
      }
      else {
        cVar2 = *pcVar8;
        if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_00162afc;
        pcVar8 = pcVar8 + 1;
      }
      iVar10 = iVar10 + cVar2;
      if ((int)local_d8 <= iVar10) goto LAB_00162afc;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  lVar4 = 0;
LAB_00162afc:
  local_78._0_8_ = &local_d4;
  local_78._8_8_ = local_c8;
  local_78._16_8_ = local_d8;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80;
  local_48 = (bool *)local_e2;
  local_40 = local_e0;
  local_38 = local_da;
  local_60 = (buffer<char16_t> *)fp;
  local_58 = &local_b8;
  bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_&>
                    (out,specs,uVar6 + lVar4,uVar6 + lVar4,(anon_class_72_9_d68ba176 *)local_78);
LAB_00162c07:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._M_allocated_capacity._4_4_,local_b8._M_allocated_capacity._0_4_) !=
      &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_),
                    local_a8._M_allocated_capacity + 1);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}